

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O2

uint32_t __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::setup
          (cache<uint256,_SignatureCacheHasher> *this,uint32_t new_size)

{
  long lVar1;
  uint uVar2;
  uint32_t uVar3;
  long in_FS_OFFSET;
  float fVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 2;
  if (2 < new_size) {
    uVar2 = new_size;
  }
  this->size = uVar2;
  fVar4 = log2f((float)uVar2);
  this->depth_limit = (uint8_t)(int)fVar4;
  std::vector<uint256,_std::allocator<uint256>_>::resize(&this->table,(ulong)this->size);
  bit_packed_atomic_flags::setup(&this->collection_flags,this->size);
  std::vector<bool,_std::allocator<bool>_>::resize(&this->epoch_flags,(ulong)this->size,false);
  uVar2 = (this->size * 0x2d) / 100;
  uVar3 = uVar2 + (uVar2 == 0);
  this->epoch_size = uVar3;
  this->epoch_heuristic_counter = uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this->size;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t setup(uint32_t new_size)
    {
        // depth_limit must be at least one otherwise errors can occur.
        size = std::max<uint32_t>(2, new_size);
        depth_limit = static_cast<uint8_t>(std::log2(static_cast<float>(size)));
        table.resize(size);
        collection_flags.setup(size);
        epoch_flags.resize(size);
        // Set to 45% as described above
        epoch_size = std::max(uint32_t{1}, (45 * size) / 100);
        // Initially set to wait for a whole epoch
        epoch_heuristic_counter = epoch_size;
        return size;
    }